

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

long bio_call_callback(BIO *b,int oper,char *argp,size_t len,int argi,long argl,long inret,
                      size_t *processed)

{
  uint uVar1;
  ulong in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  ulong in_stack_00000008;
  ulong *in_stack_00000010;
  int bareoper;
  long ret;
  ulong local_40;
  undefined4 local_2c;
  ulong local_8;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    uVar1 = in_ESI & 0xffffff7f;
    if (((uVar1 == 2) || (uVar1 == 3)) || (local_2c = in_R8D, uVar1 == 5)) {
      if (0x7fffffff < in_RCX) {
        return -1;
      }
      local_2c = (undefined4)in_RCX;
    }
    if (((0 < (long)in_stack_00000008) && ((in_ESI & 0x80) != 0)) && (uVar1 != 6)) {
      if (0x7fffffff < *in_stack_00000010) {
        return -1;
      }
      in_stack_00000008 = *in_stack_00000010;
    }
    local_40 = (**(code **)(in_RDI + 0x10))(in_RDI,in_ESI,in_RDX,local_2c,in_R9,in_stack_00000008);
    if (((0 < (long)local_40) && ((in_ESI & 0x80) != 0)) && (uVar1 != 6)) {
      *in_stack_00000010 = local_40;
      local_40 = 1;
    }
    local_8 = local_40;
  }
  else {
    local_8 = (**(code **)(in_RDI + 0x18))(in_RDI,in_ESI,in_RDX,in_RCX,in_R8D,in_R9);
  }
  return local_8;
}

Assistant:

static long bio_call_callback(BIO *b, int oper, const char *argp, size_t len,
                              int argi, long argl, long inret,
                              size_t *processed)
{
    long ret = inret;
#ifndef OPENSSL_NO_DEPRECATED_3_0
    int bareoper;

    if (b->callback_ex != NULL)
#endif
        return b->callback_ex(b, oper, argp, len, argi, argl, inret, processed);

#ifndef OPENSSL_NO_DEPRECATED_3_0
    /* Strip off any BIO_CB_RETURN flag */
    bareoper = oper & ~BIO_CB_RETURN;

    /*
     * We have an old style callback, so we will have to do nasty casts and
     * check for overflows.
     */
    if (HAS_LEN_OPER(bareoper)) {
        /* In this case |len| is set, and should be used instead of |argi| */
        if (len > INT_MAX)
            return -1;

        argi = (int)len;
    }

    if (inret > 0 && (oper & BIO_CB_RETURN) && bareoper != BIO_CB_CTRL) {
        if (*processed > INT_MAX)
            return -1;
        inret = *processed;
    }

    ret = b->callback(b, oper, argp, argi, argl, inret);

    if (ret > 0 && (oper & BIO_CB_RETURN) && bareoper != BIO_CB_CTRL) {
        *processed = (size_t)ret;
        ret = 1;
    }
#endif
    return ret;
}